

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O2

Term * __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,uint c,uint srt)

{
  Symbol *this_00;
  Term *pTVar1;
  bool bVar2;
  uint symbolNumber;
  TermList resultSort;
  OperatorType *type;
  uint i;
  Term *t;
  pair<unsigned_int,_unsigned_int> pair;
  string name;
  Term *local_c0;
  pair<unsigned_int,_unsigned_int> local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8.second = srt;
  local_b8.first = c;
  bVar2 = Lib::
          DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::find(&this->_domainConstants,&local_b8,&local_c0);
  if (!bVar2) {
    std::operator+(&local_50,"domCon_",&(DAT_00a14190->_typeCons)._stack[(int)srt]->_name);
    std::operator+(&local_90,&local_50,"_");
    Lib::Int::toString_abi_cxx11_(&local_b0,(Int *)(ulong)c,i);
    std::operator+(&local_70,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    symbolNumber = Kernel::Signature::addFreshFunction
                             (DAT_00a14190,0,local_70._M_dataplus._M_p,(char *)0x0);
    resultSort._content = (uint64_t)Kernel::AtomicSort::createConstant(srt);
    this_00 = (DAT_00a14190->_funs)._stack[symbolNumber];
    type = Kernel::OperatorType::getConstantsType(resultSort,0);
    Kernel::Signature::Symbol::setType(this_00,type);
    local_c0 = Kernel::Term::createConstant(symbolNumber);
    Lib::
    DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert(&this->_domainConstants,local_b8,local_c0);
    Lib::
    DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::insert(&this->_domainConstantsRev,local_c0,local_b8);
    pTVar1 = local_c0;
    std::__cxx11::string::~string((string *)&local_70);
    local_c0 = pTVar1;
  }
  return local_c0;
}

Assistant:

Term* getDomainConstant(unsigned c, unsigned srt)
  {
    Term* t;
    std::pair<unsigned,unsigned> pair = std::make_pair(c,srt);
    if(_domainConstants.find(pair,t)) return t;
    std::string name = "domCon_"+env.signature->typeConName(srt)+"_"+Lib::Int::toString(c);
    unsigned f = env.signature->addFreshFunction(0,name.c_str());
    TermList srtT = TermList(AtomicSort::createConstant(srt));
    env.signature->getFunction(f)->setType(OperatorType::getConstantsType(srtT));
    t = Term::createConstant(f);
    _domainConstants.insert(pair,t);
    _domainConstantsRev.insert(t,pair);

    return t;
  }